

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_time.cc
# Opt level: O3

LPSTRUC_MSG_HEADER __thiscall CSocekt::RemoveFirstTimer(CSocekt *this)

{
  iterator __position;
  _Base_ptr p_Var1;
  
  if (this->m_cur_size_ == 0) {
    p_Var1 = (_Base_ptr)0x0;
  }
  else {
    __position._M_node =
         (this->m_timerQueuemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = __position._M_node[1]._M_parent;
    std::
    _Rb_tree<long,std::pair<long_const,_STRUC_MSG_HEADER*>,std::_Select1st<std::pair<long_const,_STRUC_MSG_HEADER*>>,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
    ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,_STRUC_MSG_HEADER*>,std::_Select1st<std::pair<long_const,_STRUC_MSG_HEADER*>>,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
                        *)&this->m_timerQueuemap,__position);
    this->m_cur_size_ = this->m_cur_size_ - 1;
  }
  return (LPSTRUC_MSG_HEADER)p_Var1;
}

Assistant:

LPSTRUC_MSG_HEADER CSocekt::RemoveFirstTimer()
{
	std::multimap<time_t, LPSTRUC_MSG_HEADER>::iterator pos;	
	LPSTRUC_MSG_HEADER p_tmp;
	if(m_cur_size_ <= 0)
	{
		return NULL;
	}
	pos = m_timerQueuemap.begin(); //调用者负责互斥的，这里直接操作没问题的
	p_tmp = pos->second;
	m_timerQueuemap.erase(pos);
	--m_cur_size_;
	return p_tmp;
}